

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw_merge.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  int *actual_write_size;
  vector<double,_std::allocator<double>_> *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_8;
  int i_1;
  int diff_1;
  int i;
  int diff;
  ostringstream error_message_7;
  int curr_reference_vector_index;
  int curr_query_vector_index;
  int prev_reference_vector_index;
  int prev_query_vector_index;
  vector<double,_std::allocator<double>_> reference_vector;
  vector<double,_std::allocator<double>_> query_vector;
  int length;
  istream *input_stream_for_query;
  ostringstream error_message_6;
  ifstream ifs3;
  istream *input_stream_for_reference;
  ostringstream error_message_5;
  ifstream ifs2;
  istream *input_stream_for_path;
  ostringstream error_message_4;
  ifstream ifs1;
  ostringstream error_message_3;
  ostringstream error_message_2;
  int num_input_files;
  char *query_file;
  char *reference_file;
  char *viterbi_path_file;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int num_order;
  option *in_stack_ffffffffffffe8e8;
  istream *in_stack_ffffffffffffe8f0;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffe8f8;
  undefined1 in_stack_ffffffffffffe8fc;
  undefined1 in_stack_ffffffffffffe8fd;
  undefined1 in_stack_ffffffffffffe8fe;
  undefined1 in_stack_ffffffffffffe8ff;
  allocator *in_stack_ffffffffffffe900;
  undefined4 in_stack_ffffffffffffe908;
  undefined1 in_stack_ffffffffffffe90c;
  bool bVar7;
  undefined1 in_stack_ffffffffffffe90d;
  undefined1 in_stack_ffffffffffffe90e;
  undefined1 in_stack_ffffffffffffe90f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe910;
  istream *input_stream;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  int in_stack_ffffffffffffe938;
  undefined4 in_stack_ffffffffffffe93c;
  int read_point;
  undefined8 in_stack_ffffffffffffe940;
  undefined7 in_stack_ffffffffffffe950;
  byte in_stack_ffffffffffffe957;
  bool local_15e2;
  allocator local_15c9;
  string local_15c8 [32];
  ostringstream local_15a8 [128];
  ostringstream *in_stack_ffffffffffffead8;
  string *in_stack_ffffffffffffeae0;
  int local_142c;
  int local_1424;
  allocator local_1419;
  string local_1418 [32];
  ostringstream local_13f8 [380];
  int local_127c;
  int local_1278;
  int local_1274;
  int local_1270;
  istream local_1249 [29];
  int local_122c;
  vector<double,_std::allocator<double>_> *local_1228;
  allocator local_1219;
  string local_1218 [32];
  ostringstream local_11f8 [376];
  vector<double,_std::allocator<double>_> local_1080 [21];
  char *local_e78;
  allocator local_e69;
  string local_e68 [32];
  ostringstream local_e48 [376];
  char local_cd0 [520];
  char *local_ac8;
  undefined4 local_ac0;
  allocator local_ab9;
  string local_ab8 [32];
  ostringstream local_a98 [376];
  char local_920 [527];
  allocator local_711;
  string local_710 [32];
  ostringstream local_6f0 [383];
  allocator local_571;
  string local_570 [32];
  ostringstream local_550 [380];
  int local_3d4;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  allocator local_3b1;
  string local_3b0 [32];
  ostringstream local_390 [383];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  ostringstream local_1c8 [399];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_18 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe900 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffe8ff,
                                                     CONCAT16(in_stack_ffffffffffffe8fe,
                                                              CONCAT15(in_stack_ffffffffffffe8fd,
                                                                       CONCAT14(
                                                  in_stack_ffffffffffffe8fc,
                                                  in_stack_ffffffffffffe8f8)))),
                                   (char *)in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8e8,
                                   (int *)0x1036bf), pcVar1 = ya_optarg, local_18 != -1) {
    if (local_18 == 0x68) {
      anon_unknown.dwarf_1727::PrintUsage((ostream *)in_stack_ffffffffffffe900);
      return 0;
    }
    if (local_18 == 0x6c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar1,&local_39);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffe8ff,
                                  CONCAT16(in_stack_ffffffffffffe8fe,
                                           CONCAT15(in_stack_ffffffffffffe8fd,
                                                    CONCAT14(in_stack_ffffffffffffe8fc,
                                                             in_stack_ffffffffffffe8f8)))),
                         (int *)in_stack_ffffffffffffe8f0);
      local_15e2 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      if (local_15e2) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        std::operator<<((ostream *)local_1c8,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e8,"dtw_merge",&local_1e9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1c8);
        return local_4;
      }
      local_14 = local_14 + -1;
    }
    else {
      if (local_18 != 0x6d) {
        anon_unknown.dwarf_1727::PrintUsage((ostream *)in_stack_ffffffffffffe900);
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,pcVar1,&local_211);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffe8ff,
                                  CONCAT16(in_stack_ffffffffffffe8fe,
                                           CONCAT15(in_stack_ffffffffffffe8fd,
                                                    CONCAT14(in_stack_ffffffffffffe8fc,
                                                             in_stack_ffffffffffffe8f8)))),
                         (int *)in_stack_ffffffffffffe8f0);
      bVar7 = local_14 < 0;
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      if (!bVar2 || bVar7) {
        std::__cxx11::ostringstream::ostringstream(local_390);
        poVar5 = std::operator<<((ostream *)local_390,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b0,"dtw_merge",&local_3b1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
        std::__cxx11::string::~string(local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_390);
        return local_4;
      }
    }
  }
  local_3d4 = local_8 - ya_optind;
  if (local_3d4 == 3) {
    local_3c0 = *(char **)(local_10 + (long)(local_8 + -3) * 8);
    local_3c8 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_3d0 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_3d4 != 2) {
      std::__cxx11::ostringstream::ostringstream(local_550);
      std::operator<<((ostream *)local_550,"Three input files are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_570,"dtw_merge",&local_571);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
      std::__cxx11::string::~string(local_570);
      std::allocator<char>::~allocator((allocator<char> *)&local_571);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_550);
      return local_4;
    }
    local_3c0 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_3c8 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_3d0 = (char *)0x0;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_6f0);
    std::operator<<((ostream *)local_6f0,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_710,"dtw_merge",&local_711);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
    std::__cxx11::string::~string(local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_6f0);
    return local_4;
  }
  std::ifstream::ifstream(local_920);
  pcVar1 = local_3c0;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_920,(_Ios_Openmode)pcVar1);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_a98);
    poVar5 = std::operator<<((ostream *)local_a98,"Cannot open file ");
    std::operator<<(poVar5,local_3c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ab8,"dtw_merge",&local_ab9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
    std::__cxx11::string::~string(local_ab8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
    local_4 = 1;
    local_ac0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a98);
    goto LAB_00104ba2;
  }
  local_ac8 = local_920;
  std::ifstream::ifstream(local_cd0);
  pcVar1 = local_3c8;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_cd0,(_Ios_Openmode)pcVar1);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) == 0) {
    local_e78 = local_cd0;
    std::ifstream::ifstream(local_1080);
    pcVar1 = local_3d0;
    if (local_3d0 == (char *)0x0) {
LAB_001044a7:
      bVar3 = std::ifstream::is_open();
      read_point = CONCAT13(bVar3,(int3)in_stack_ffffffffffffe93c);
      if ((bVar3 & 1) == 0) {
        sequence_to_read = (vector<double,_std::allocator<double>_> *)&std::cin;
      }
      else {
        sequence_to_read = local_1080;
      }
      local_122c = local_14 + 1;
      actual_write_size = (int *)(long)local_122c;
      input_stream = local_1249;
      local_1228 = sequence_to_read;
      std::allocator<double>::allocator((allocator<double> *)0x10451d);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffe910,
                 CONCAT17(in_stack_ffffffffffffe90f,
                          CONCAT16(in_stack_ffffffffffffe90e,
                                   CONCAT15(in_stack_ffffffffffffe90d,
                                            CONCAT14(in_stack_ffffffffffffe90c,
                                                     in_stack_ffffffffffffe908)))),
                 (allocator_type *)in_stack_ffffffffffffe900);
      std::allocator<double>::~allocator((allocator<double> *)0x104543);
      this = (vector<double,_std::allocator<double>_> *)(long)local_122c;
      std::allocator<double>::allocator((allocator<double> *)0x104562);
      std::vector<double,_std::allocator<double>_>::vector
                (this,CONCAT17(in_stack_ffffffffffffe90f,
                               CONCAT16(in_stack_ffffffffffffe90e,
                                        CONCAT15(in_stack_ffffffffffffe90d,
                                                 CONCAT14(in_stack_ffffffffffffe90c,
                                                          in_stack_ffffffffffffe908)))),
                 (allocator_type *)in_stack_ffffffffffffe900);
      std::allocator<double>::~allocator((allocator<double> *)0x104588);
      bVar2 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffe940 >> 0x30,0),
                         (int)in_stack_ffffffffffffe940,read_point,in_stack_ffffffffffffe938,
                         sequence_to_read,input_stream,
                         (int *)CONCAT17(in_stack_ffffffffffffe957,in_stack_ffffffffffffe950));
      if ((bVar2) &&
         (bVar2 = sptk::ReadStream<double>
                            (SUB81((ulong)in_stack_ffffffffffffe940 >> 0x30,0),
                             (int)in_stack_ffffffffffffe940,read_point,in_stack_ffffffffffffe938,
                             sequence_to_read,input_stream,
                             (int *)CONCAT17(in_stack_ffffffffffffe957,in_stack_ffffffffffffe950)),
         bVar2)) {
        local_1270 = 0;
        local_1274 = 0;
        do {
          bVar2 = sptk::ReadStream<int>
                            ((int *)CONCAT17(in_stack_ffffffffffffe8ff,
                                             CONCAT16(in_stack_ffffffffffffe8fe,
                                                      CONCAT15(in_stack_ffffffffffffe8fd,
                                                               CONCAT14(in_stack_ffffffffffffe8fc,
                                                                        in_stack_ffffffffffffe8f8)))
                                            ),in_stack_ffffffffffffe8f0);
          bVar7 = false;
          if (bVar2) {
            bVar7 = sptk::ReadStream<int>
                              ((int *)CONCAT17(in_stack_ffffffffffffe8ff,
                                               CONCAT16(in_stack_ffffffffffffe8fe,
                                                        CONCAT15(in_stack_ffffffffffffe8fd,
                                                                 CONCAT14(in_stack_ffffffffffffe8fc,
                                                                          in_stack_ffffffffffffe8f8)
                                                                ))),in_stack_ffffffffffffe8f0);
          }
          if (bVar7 == false) {
            local_4 = 0;
            local_ac0 = 1;
            goto LAB_00104b2e;
          }
          if ((((local_1278 < 0) || (local_127c < 0)) || (local_1278 < local_1270)) ||
             (local_127c < local_1274)) {
            std::__cxx11::ostringstream::ostringstream(local_13f8);
            std::operator<<((ostream *)local_13f8,"Invalid Viterbi path");
            in_stack_ffffffffffffe900 = &local_1419;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1418,"dtw_merge",in_stack_ffffffffffffe900);
            sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
            std::__cxx11::string::~string(local_1418);
            std::allocator<char>::~allocator((allocator<char> *)&local_1419);
            local_4 = 1;
            local_ac0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_13f8);
            goto LAB_00104b2e;
          }
          iVar4 = local_1278 - local_1270;
          for (local_1424 = 0; local_1424 < iVar4; local_1424 = local_1424 + 1) {
            in_stack_ffffffffffffe8ff =
                 sptk::ReadStream<double>
                           (SUB81((ulong)in_stack_ffffffffffffe940 >> 0x30,0),
                            (int)in_stack_ffffffffffffe940,read_point,in_stack_ffffffffffffe938,
                            sequence_to_read,input_stream,
                            (int *)CONCAT17(in_stack_ffffffffffffe957,in_stack_ffffffffffffe950));
            if (!(bool)in_stack_ffffffffffffe8ff) {
              local_4 = 0;
              local_ac0 = 1;
              goto LAB_00104b2e;
            }
          }
          local_1270 = local_1278;
          iVar4 = local_127c - local_1274;
          for (local_142c = 0; local_142c < iVar4; local_142c = local_142c + 1) {
            in_stack_ffffffffffffe8fe =
                 sptk::ReadStream<double>
                           (SUB81((ulong)in_stack_ffffffffffffe940 >> 0x30,0),
                            (int)in_stack_ffffffffffffe940,read_point,in_stack_ffffffffffffe938,
                            sequence_to_read,input_stream,
                            (int *)CONCAT17(in_stack_ffffffffffffe957,in_stack_ffffffffffffe950));
            if (!(bool)in_stack_ffffffffffffe8fe) {
              local_4 = 0;
              local_ac0 = 1;
              goto LAB_00104b2e;
            }
          }
          local_1274 = local_127c;
          in_stack_ffffffffffffe8fd =
               sptk::WriteStream<double>
                         ((int)in_stack_ffffffffffffe940,read_point,sequence_to_read,
                          (ostream *)input_stream,actual_write_size);
        } while (((bool)in_stack_ffffffffffffe8fd) &&
                (in_stack_ffffffffffffe8fc =
                      sptk::WriteStream<double>
                                ((int)in_stack_ffffffffffffe940,read_point,sequence_to_read,
                                 (ostream *)input_stream,actual_write_size),
                (bool)in_stack_ffffffffffffe8fc));
        std::__cxx11::ostringstream::ostringstream(local_15a8);
        std::operator<<((ostream *)local_15a8,"Failed to write merged vector");
        paVar6 = &local_15c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_15c8,"dtw_merge",paVar6);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
        std::__cxx11::string::~string(local_15c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
        local_4 = 1;
        local_ac0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_15a8);
      }
      else {
        local_4 = 0;
        local_ac0 = 1;
      }
LAB_00104b2e:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe900);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe900);
    }
    else {
      std::operator|(_S_in,_S_bin);
      std::ifstream::open((char *)local_1080,(_Ios_Openmode)pcVar1);
      in_stack_ffffffffffffe957 = std::ios::fail();
      if ((in_stack_ffffffffffffe957 & 1) == 0) goto LAB_001044a7;
      std::__cxx11::ostringstream::ostringstream(local_11f8);
      poVar5 = std::operator<<((ostream *)local_11f8,"Cannot open file ");
      std::operator<<(poVar5,local_3d0);
      paVar6 = &local_1219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1218,"dtw_merge",paVar6);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
      std::__cxx11::string::~string(local_1218);
      std::allocator<char>::~allocator((allocator<char> *)&local_1219);
      local_4 = 1;
      local_ac0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_11f8);
    }
    std::ifstream::~ifstream(local_1080);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e48);
    poVar5 = std::operator<<((ostream *)local_e48,"Cannot open file ");
    std::operator<<(poVar5,local_3c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e68,"dtw_merge",&local_e69);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
    std::__cxx11::string::~string(local_e68);
    std::allocator<char>::~allocator((allocator<char> *)&local_e69);
    local_4 = 1;
    local_ac0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e48);
  }
  std::ifstream::~ifstream(local_cd0);
LAB_00104ba2:
  std::ifstream::~ifstream(local_920);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* viterbi_path_file;
  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    viterbi_path_file = argv[argc - 3];
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    viterbi_path_file = argv[argc - 2];
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Three input files are required";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(viterbi_path_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << viterbi_path_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_path(ifs1);

  std::ifstream ifs2;
  ifs2.open(reference_file, std::ios::in | std::ios::binary);
  if (ifs2.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << reference_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_reference(ifs2);

  std::ifstream ifs3;
  if (NULL != query_file) {
    ifs3.open(query_file, std::ios::in | std::ios::binary);
    if (ifs3.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << query_file;
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }
  std::istream& input_stream_for_query(ifs3.is_open() ? ifs3 : std::cin);

  const int length(num_order + 1);
  std::vector<double> query_vector(length);
  std::vector<double> reference_vector(length);
  if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                        &input_stream_for_query, NULL) ||
      !sptk::ReadStream(false, 0, 0, length, &reference_vector,
                        &input_stream_for_reference, NULL)) {
    return 0;
  }

  int prev_query_vector_index(0), prev_reference_vector_index(0);
  int curr_query_vector_index, curr_reference_vector_index;
  while (
      sptk::ReadStream(&curr_query_vector_index, &input_stream_for_path) &&
      sptk::ReadStream(&curr_reference_vector_index, &input_stream_for_path)) {
    if (curr_query_vector_index < 0 || curr_reference_vector_index < 0 ||
        curr_query_vector_index < prev_query_vector_index ||
        curr_reference_vector_index < prev_reference_vector_index) {
      std::ostringstream error_message;
      error_message << "Invalid Viterbi path";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }

    {
      const int diff(curr_query_vector_index - prev_query_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                              &input_stream_for_query, NULL)) {
          return 0;
        }
      }
      prev_query_vector_index = curr_query_vector_index;
    }

    {
      const int diff(curr_reference_vector_index - prev_reference_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &reference_vector,
                              &input_stream_for_reference, NULL)) {
          return 0;
        }
      }
      prev_reference_vector_index = curr_reference_vector_index;
    }

    if (!sptk::WriteStream(0, length, query_vector, &std::cout, NULL) ||
        !sptk::WriteStream(0, length, reference_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write merged vector";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }

  return 0;
}